

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handle_join_leave.cxx
# Opt level: O3

ptr<resp_msg> __thiscall nuraft::raft_server::handle_rm_srv_req(raft_server *this,req_msg *req)

{
  byte bVar1;
  undefined4 uVar2;
  uint uVar3;
  _func_int *p_Var4;
  pointer psVar5;
  undefined8 *puVar6;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  _func_int **pp_Var7;
  peer *this_01;
  int iVar8;
  element_type *peVar9;
  buffer *pbVar10;
  size_t sVar11;
  iterator iVar12;
  long lVar13;
  long in_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var14;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_02;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_03;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_04;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_05;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_06;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_07;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_08;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_09;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_10;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_11;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_12;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_13;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_14;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_15;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_16;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_17;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_18;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_19;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_20;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_21;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_22;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_23;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_24;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_25;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_26;
  msg_type *pmVar15;
  bool bVar16;
  ptr<resp_msg> pVar17;
  undefined1 auVar18 [16];
  int32 srv_id;
  ptr<req_msg> leave_req;
  string local_88;
  undefined8 local_68;
  uint local_5c;
  ptr<req_msg> local_58;
  ptr<peer> local_48;
  req_msg *local_38;
  
  p_Var4 = req[9].super_msg_base._vptr_msg_base[1];
  this->_vptr_raft_server = (_func_int **)0x0;
  peVar9 = (element_type *)operator_new(0xb0);
  (peVar9->super_enable_shared_from_this<nuraft::raft_server>)._M_weak_this.
  super___weak_ptr<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x100000001;
  peVar9->_vptr_raft_server = (_func_int **)&PTR___Sp_counted_ptr_inplace_0061c2e8;
  uVar2 = *(undefined4 *)
           &(req->log_entries_).
            super__Vector_base<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  uVar3 = *(uint *)((long)&req->commit_idx_ + 4);
  _Var14._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(ulong)uVar3;
  (peVar9->bg_commit_thread_)._M_id._M_thread = (native_handle_type)p_Var4;
  *(undefined4 *)&(peVar9->bg_append_thread_)._M_id._M_thread = 9;
  *(undefined4 *)((long)&(peVar9->bg_append_thread_)._M_id._M_thread + 4) = uVar2;
  *(uint *)&peVar9->bg_append_ea_ = uVar3;
  (peVar9->super_enable_shared_from_this<nuraft::raft_server>)._M_weak_this.
  super___weak_ptr<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&PTR__resp_msg_0061c338;
  (peVar9->priority_change_timer_).t_created_.__d.__r = 0;
  (peVar9->priority_change_timer_).duration_us_ = 0;
  *(undefined8 *)&(peVar9->priority_change_timer_).first_event_fired_ = 0;
  (peVar9->priority_change_timer_).lock_.super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(peVar9->priority_change_timer_).lock_.super___mutex_base._M_mutex + 8) = 0
  ;
  *(undefined8 *)((long)&(peVar9->priority_change_timer_).lock_.super___mutex_base._M_mutex + 0x10)
       = 0;
  (peVar9->priority_change_timer_).lock_.super___mutex_base._M_mutex.__data.__list.__prev =
       (__pthread_internal_list *)0x0;
  (peVar9->priority_change_timer_).lock_.super___mutex_base._M_mutex.__data.__list.__next =
       (__pthread_internal_list *)0x0;
  peVar9->votes_responded_ = 0;
  peVar9->votes_granted_ = 0;
  (peVar9->precommit_index_).super___atomic_base<unsigned_long>._M_i = 0;
  (peVar9->leader_commit_index_).super___atomic_base<unsigned_long>._M_i = 0;
  (peVar9->quick_commit_index_).super___atomic_base<unsigned_long>._M_i = 0;
  *(undefined4 *)&(peVar9->sm_commit_index_).super___atomic_base<unsigned_long>._M_i = 0;
  peVar9->initialized_ = (__atomic_base<bool>)0x0;
  *(undefined3 *)&peVar9->field_0x31 = 0;
  peVar9->leader_ = (__atomic_base<int>)0x0;
  peVar9->id_ = 0;
  peVar9->my_priority_ = 0;
  *(undefined1 *)&peVar9->target_priority_ = 0;
  (this->super_enable_shared_from_this<nuraft::raft_server>)._M_weak_this.
  super___weak_ptr<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar9;
  this->_vptr_raft_server =
       (_func_int **)
       &(peVar9->super_enable_shared_from_this<nuraft::raft_server>)._M_weak_this.
        super___weak_ptr<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
  if (*(long *)(in_RDX + 0x40) - (long)*(undefined8 **)(in_RDX + 0x38) == 0x10) {
    pbVar10 = log_entry::get_buf((log_entry *)**(undefined8 **)(in_RDX + 0x38));
    sVar11 = buffer::size(pbVar10);
    _Var14._M_pi = extraout_RDX;
    if (sVar11 == 4) {
      if ((*(int *)&req[8].log_entries_.
                    super__Vector_base<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage == 3) &&
         (((ulong)req[3].super_msg_base._vptr_msg_base & 1) == 0)) {
        check_srv_to_leave_timeout((raft_server *)req);
        _Var14._M_pi = extraout_RDX_06;
        if (req[0xb].log_entries_.
            super__Vector_base<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage == (pointer)0x0) {
          local_38 = req + 6;
          pmVar15 = &req[6].super_msg_base.type_;
          local_68 = (element_type *)((ulong)local_68._4_4_ << 0x20);
          do {
            pmVar15 = *(msg_type **)pmVar15;
            if (pmVar15 == (msg_type *)0x0) {
              if (*(char *)((long)&req[2].log_entries_.
                                   super__Vector_base<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage + 1) == '\x01'
                 ) {
                psVar5 = req[9].log_entries_.
                         super__Vector_base<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage;
                if ((psVar5 != (pointer)0x0) &&
                   (iVar8 = (*(code *)(psVar5->
                                      super___shared_ptr<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2>
                                      )._M_ptr[1].buff_.
                                      super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>
                                      ._M_ptr)(), _Var14._M_pi = extraout_RDX_14, 2 < iVar8)) {
                  psVar5 = req[9].log_entries_.
                           super__Vector_base<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage;
                  msg_if_given_abi_cxx11_(&local_88,"previous config has not committed yet");
                  (*(code *)(psVar5->
                            super___shared_ptr<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2>).
                            _M_ptr[1].buff_.
                            super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount._M_pi)
                            (psVar5,3,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_join_leave.cxx"
                             ,"handle_rm_srv_req",0x192,&local_88);
                  _Var14._M_pi = extraout_RDX_15;
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_88._M_dataplus._M_p != &local_88.field_2) {
                    operator_delete(local_88._M_dataplus._M_p);
                    _Var14._M_pi = extraout_RDX_16;
                  }
                }
                *(undefined4 *)(this->_vptr_raft_server + 0x13) = 0xfffffffa;
                goto LAB_00221515;
              }
              pbVar10 = log_entry::get_buf((log_entry *)**(undefined8 **)(in_RDX + 0x38));
              local_5c = buffer::get_int(pbVar10);
              if (local_5c ==
                  *(uint *)&(req->log_entries_).
                            super__Vector_base<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>
                            ._M_impl.super__Vector_impl_data._M_start) {
                psVar5 = req[9].log_entries_.
                         super__Vector_base<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage;
                _Var14._M_pi = extraout_RDX_17;
                if ((psVar5 != (pointer)0x0) &&
                   (iVar8 = (*(code *)(psVar5->
                                      super___shared_ptr<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2>
                                      )._M_ptr[1].buff_.
                                      super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>
                                      ._M_ptr)(), _Var14._M_pi = extraout_RDX_18, 2 < iVar8)) {
                  psVar5 = req[9].log_entries_.
                           super__Vector_base<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage;
                  msg_if_given_abi_cxx11_(&local_88,"cannot request to remove leader");
                  (*(code *)(psVar5->
                            super___shared_ptr<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2>).
                            _M_ptr[1].buff_.
                            super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount._M_pi)
                            (psVar5,3,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_join_leave.cxx"
                             ,"handle_rm_srv_req",0x199,&local_88);
                  _Var14._M_pi = extraout_RDX_19;
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_88._M_dataplus._M_p != &local_88.field_2) {
                    operator_delete(local_88._M_dataplus._M_p);
                    _Var14._M_pi = extraout_RDX_20;
                  }
                }
                *(undefined4 *)(this->_vptr_raft_server + 0x13) = 0xfffffff7;
                goto LAB_00221515;
              }
              iVar12 = std::
                       _Hashtable<int,_std::pair<const_int,_std::shared_ptr<nuraft::peer>_>,_std::allocator<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                       ::find((_Hashtable<int,_std::pair<const_int,_std::shared_ptr<nuraft::peer>_>,_std::allocator<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                               *)local_38,(key_type_conflict *)&local_5c);
              if (iVar12.
                  super__Node_iterator_base<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>,_false>
                  ._M_cur == (__node_type *)0x0) {
                psVar5 = req[9].log_entries_.
                         super__Vector_base<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage;
                _Var14._M_pi = extraout_RDX_21;
                if ((psVar5 != (pointer)0x0) &&
                   (iVar8 = (*(code *)(psVar5->
                                      super___shared_ptr<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2>
                                      )._M_ptr[1].buff_.
                                      super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>
                                      ._M_ptr)(), _Var14._M_pi = extraout_RDX_22, 2 < iVar8)) {
                  psVar5 = req[9].log_entries_.
                           super__Vector_base<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage;
                  msg_if_given_abi_cxx11_(&local_88,"server %d does not exist",(ulong)local_5c);
                  (*(code *)(psVar5->
                            super___shared_ptr<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2>).
                            _M_ptr[1].buff_.
                            super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount._M_pi)
                            (psVar5,3,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_join_leave.cxx"
                             ,"handle_rm_srv_req",0x1a0,&local_88);
                  _Var14._M_pi = extraout_RDX_23;
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_88._M_dataplus._M_p != &local_88.field_2) {
                    operator_delete(local_88._M_dataplus._M_p);
                    _Var14._M_pi = extraout_RDX_24;
                  }
                }
                *(undefined4 *)(this->_vptr_raft_server + 0x13) = 0xfffffff8;
                goto LAB_00221515;
              }
              this_01 = *(peer **)((long)iVar12.
                                         super__Node_iterator_base<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>,_false>
                                         ._M_cur + 0x10);
              local_68 = *(element_type **)
                          ((long)iVar12.
                                 super__Node_iterator_base<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>,_false>
                                 ._M_cur + 0x18);
              if (local_68 != (element_type *)0x0) {
                if (__libc_single_threaded == '\0') {
                  LOCK();
                  *(int *)&(local_68->super_enable_shared_from_this<nuraft::raft_server>).
                           _M_weak_this.
                           super___weak_ptr<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                       = *(int *)&(local_68->super_enable_shared_from_this<nuraft::raft_server>).
                                  _M_weak_this.
                                  super___weak_ptr<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2>.
                                  _M_ptr + 1;
                  UNLOCK();
                }
                else {
                  *(int *)&(local_68->super_enable_shared_from_this<nuraft::raft_server>).
                           _M_weak_this.
                           super___weak_ptr<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                       = *(int *)&(local_68->super_enable_shared_from_this<nuraft::raft_server>).
                                  _M_weak_this.
                                  super___weak_ptr<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2>.
                                  _M_ptr + 1;
                }
              }
              p_Var4 = req[9].super_msg_base._vptr_msg_base[1];
              lVar13 = (**(code **)(**(long **)&req[9].super_msg_base.type_ + 0x10))();
              pp_Var7 = req[2].super_msg_base._vptr_msg_base;
              local_58.super___shared_ptr<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
              _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x60);
              peVar9 = local_68;
              (local_58.super___shared_ptr<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
              _M_pi)->_M_use_count = 1;
              (local_58.super___shared_ptr<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
              _M_pi)->_M_weak_count = 1;
              (local_58.super___shared_ptr<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
              _M_pi)->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_0061c4f0;
              local_58.super___shared_ptr<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                   (element_type *)
                   (local_58.super___shared_ptr<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi + 1);
              uVar2 = *(undefined4 *)
                       &(req->log_entries_).
                        super__Vector_base<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              *(_func_int **)
               &local_58.super___shared_ptr<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                ._M_pi[1]._M_use_count = p_Var4;
              *(undefined4 *)
               &local_58.super___shared_ptr<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                ._M_pi[2]._vptr__Sp_counted_base = 0xe;
              *(undefined4 *)
               ((long)&local_58.super___shared_ptr<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi[2]._vptr__Sp_counted_base + 4) = uVar2;
              local_58.super___shared_ptr<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
              _M_pi[2]._M_use_count = local_5c;
              local_58.super___shared_ptr<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
              _M_pi[1]._vptr__Sp_counted_base = (_func_int **)&PTR__req_msg_0061c540;
              local_58.super___shared_ptr<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
              _M_pi[3]._vptr__Sp_counted_base = (_func_int **)0x0;
              *(long *)&local_58.super___shared_ptr<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount._M_pi[3]._M_use_count = lVar13 + -1;
              local_58.super___shared_ptr<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
              _M_pi[4]._vptr__Sp_counted_base = pp_Var7;
              local_58.super___shared_ptr<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
              _M_pi[4]._M_use_count = 0;
              local_58.super___shared_ptr<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
              _M_pi[4]._M_weak_count = 0;
              local_58.super___shared_ptr<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
              _M_pi[5]._vptr__Sp_counted_base = (_func_int **)0x0;
              local_58.super___shared_ptr<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
              _M_pi[5]._M_use_count = 0;
              local_58.super___shared_ptr<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
              _M_pi[5]._M_weak_count = 0;
              LOCK();
              (this_01->leave_requested_)._M_base._M_i = true;
              UNLOCK();
              LOCK();
              bVar16 = (this_01->busy_flag_)._M_base._M_i == false;
              if (bVar16) {
                (this_01->busy_flag_)._M_base._M_i = true;
              }
              UNLOCK();
              if (bVar16) {
                local_48.super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_68;
                if (local_68 != (element_type *)0x0) {
                  if (__libc_single_threaded == '\0') {
                    LOCK();
                    *(int *)&(local_68->super_enable_shared_from_this<nuraft::raft_server>).
                             _M_weak_this.
                             super___weak_ptr<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2>.
                             _M_ptr =
                         *(int *)&(local_68->super_enable_shared_from_this<nuraft::raft_server>).
                                  _M_weak_this.
                                  super___weak_ptr<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2>.
                                  _M_ptr + 1;
                    UNLOCK();
                  }
                  else {
                    *(int *)&(local_68->super_enable_shared_from_this<nuraft::raft_server>).
                             _M_weak_this.
                             super___weak_ptr<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2>.
                             _M_ptr =
                         *(int *)&(local_68->super_enable_shared_from_this<nuraft::raft_server>).
                                  _M_weak_this.
                                  super___weak_ptr<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2>.
                                  _M_ptr + 1;
                  }
                }
                local_48.super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                     this_01;
                peer::send_req(this_01,&local_48,&local_58,
                               (rpc_handler *)&req[0x12].super_msg_base.term_);
                if ((element_type *)
                    local_48.super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi != (element_type *)0x0) {
                  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                            (local_48.super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>.
                             _M_refcount._M_pi);
                }
                psVar5 = req[9].log_entries_.
                         super__Vector_base<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage;
                if ((psVar5 != (pointer)0x0) &&
                   (iVar8 = (*(code *)(psVar5->
                                      super___shared_ptr<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2>
                                      )._M_ptr[1].buff_.
                                      super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>
                                      ._M_ptr)(), 3 < iVar8)) {
                  psVar5 = req[9].log_entries_.
                           super__Vector_base<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage;
                  msg_if_given_abi_cxx11_
                            (&local_88,"sent leave request to peer %d",
                             (ulong)(uint)((this_01->config_).
                                           super___shared_ptr<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2>
                                          ._M_ptr)->id_);
                  (*(code *)(psVar5->
                            super___shared_ptr<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2>).
                            _M_ptr[1].buff_.
                            super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount._M_pi)
                            (psVar5,4,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_join_leave.cxx"
                             ,"handle_rm_srv_req",0x1b4,&local_88);
LAB_00221af6:
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_88._M_dataplus._M_p != &local_88.field_2) {
                    operator_delete(local_88._M_dataplus._M_p);
                  }
                }
              }
              else {
                peer::set_rsv_msg(this_01,&local_58,(rpc_handler *)&req[0x12].super_msg_base.term_);
                psVar5 = req[9].log_entries_.
                         super__Vector_base<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage;
                if ((psVar5 != (pointer)0x0) &&
                   (iVar8 = (*(code *)(psVar5->
                                      super___shared_ptr<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2>
                                      )._M_ptr[1].buff_.
                                      super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>
                                      ._M_ptr)(), 3 < iVar8)) {
                  psVar5 = req[9].log_entries_.
                           super__Vector_base<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage;
                  msg_if_given_abi_cxx11_
                            (&local_88,"peer %d is currently busy, keep the message",
                             (ulong)(uint)((this_01->config_).
                                           super___shared_ptr<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2>
                                          ._M_ptr)->id_);
                  (*(code *)(psVar5->
                            super___shared_ptr<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2>).
                            _M_ptr[1].buff_.
                            super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount._M_pi)
                            (psVar5,4,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_join_leave.cxx"
                             ,"handle_rm_srv_req",0x1b7,&local_88);
                  goto LAB_00221af6;
                }
              }
              pp_Var7 = this->_vptr_raft_server;
              auVar18 = (**(code **)(**(long **)&req[9].super_msg_base.type_ + 0x10))();
              _Var14._M_pi = auVar18._8_8_;
              pp_Var7[4] = auVar18._0_8_;
              *(undefined1 *)(pp_Var7 + 6) = 1;
              if (local_58.super___shared_ptr<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          (local_58.super___shared_ptr<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2>.
                           _M_refcount._M_pi);
                _Var14._M_pi = extraout_RDX_25;
              }
              goto joined_r0x00221b35;
            }
            puVar6 = *(undefined8 **)(pmVar15 + 4);
            this_00 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(pmVar15 + 6);
            if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              if (__libc_single_threaded == '\0') {
                LOCK();
                this_00->_M_use_count = this_00->_M_use_count + 1;
                UNLOCK();
              }
              else {
                this_00->_M_use_count = this_00->_M_use_count + 1;
              }
            }
            bVar1 = *(byte *)((long)puVar6 + 0x1dc);
            if ((bVar1 & 1) != 0) {
              psVar5 = req[9].log_entries_.
                       super__Vector_base<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage;
              if ((psVar5 != (pointer)0x0) &&
                 (iVar8 = (*(code *)(psVar5->
                                    super___shared_ptr<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2>
                                    )._M_ptr[1].buff_.
                                    super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>.
                                    _M_ptr)(), _Var14._M_pi = extraout_RDX_10, 2 < iVar8)) {
                local_68 = (element_type *)
                           req[9].log_entries_.
                           super__Vector_base<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage;
                msg_if_given_abi_cxx11_
                          (&local_88,
                           "leave flag of server %d is set, but the server has not left yet",
                           (ulong)*(uint *)*puVar6);
                (*local_68->_vptr_raft_server[8])
                          (local_68,3,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_join_leave.cxx"
                           ,"handle_rm_srv_req",0x18a,&local_88);
                _Var14._M_pi = extraout_RDX_11;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_88._M_dataplus._M_p != &local_88.field_2) {
                  operator_delete(local_88._M_dataplus._M_p);
                  _Var14._M_pi = extraout_RDX_12;
                }
              }
              pp_Var7 = this->_vptr_raft_server;
              *(undefined4 *)(pp_Var7 + 0x13) = 0xfffffff6;
              local_68 = (element_type *)
                         CONCAT44(local_68._4_4_,(int)CONCAT71((int7)((ulong)pp_Var7 >> 8),1));
            }
            if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
              _Var14._M_pi = extraout_RDX_13;
            }
          } while ((bVar1 & 1) == 0);
          if (((ulong)local_68 & 1) == 0) {
            peVar9 = (this->super_enable_shared_from_this<nuraft::raft_server>)._M_weak_this.
                     super___weak_ptr<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
joined_r0x00221b35:
            if (peVar9 != (element_type *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)peVar9);
              _Var14._M_pi = extraout_RDX_26;
            }
          }
        }
        else {
          psVar5 = req[9].log_entries_.
                   super__Vector_base<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage;
          if ((psVar5 != (pointer)0x0) &&
             (iVar8 = (*(code *)(psVar5->
                                super___shared_ptr<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2>).
                                _M_ptr[1].buff_.
                                super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>.
                                _M_ptr)(), _Var14._M_pi = extraout_RDX_07, 2 < iVar8)) {
            psVar5 = req[9].log_entries_.
                     super__Vector_base<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage;
            msg_if_given_abi_cxx11_
                      (&local_88,"previous to-be-removed server %d has not left yet",
                       (ulong)(uint)(((req[0xb].log_entries_.
                                       super__Vector_base<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>
                                       ._M_impl.super__Vector_impl_data._M_end_of_storage)->
                                     super___shared_ptr<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2>
                                     )._M_ptr)->term_);
            (*(code *)(psVar5->super___shared_ptr<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2>).
                      _M_ptr[1].buff_.super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>
                      ._M_refcount._M_pi)
                      (psVar5,3,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_join_leave.cxx"
                       ,"handle_rm_srv_req",0x17e,&local_88);
            _Var14._M_pi = extraout_RDX_08;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_88._M_dataplus._M_p != &local_88.field_2) {
              operator_delete(local_88._M_dataplus._M_p);
              _Var14._M_pi = extraout_RDX_09;
            }
          }
          *(undefined4 *)(this->_vptr_raft_server + 0x13) = 0xfffffff6;
        }
      }
      else {
        psVar5 = req[9].log_entries_.
                 super__Vector_base<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage;
        if ((psVar5 != (pointer)0x0) &&
           (iVar8 = (*(code *)(psVar5->
                              super___shared_ptr<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2>).
                              _M_ptr[1].buff_.
                              super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                              (), _Var14._M_pi = extraout_RDX_00, 2 < iVar8)) {
          psVar5 = req[9].log_entries_.
                   super__Vector_base<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage;
          msg_if_given_abi_cxx11_
                    (&local_88,"this is not a leader, cannot handle RemoveServerRequest");
          (*(code *)(psVar5->super___shared_ptr<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2>).
                    _M_ptr[1].buff_.super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi)
                    (psVar5,3,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_join_leave.cxx"
                     ,"handle_rm_srv_req",0x176,&local_88);
          _Var14._M_pi = extraout_RDX_01;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_88._M_dataplus._M_p != &local_88.field_2) {
            operator_delete(local_88._M_dataplus._M_p);
            _Var14._M_pi = extraout_RDX_02;
          }
        }
        *(undefined4 *)(this->_vptr_raft_server + 0x13) = 0xfffffffd;
      }
      goto LAB_00221515;
    }
  }
  psVar5 = req[9].log_entries_.
           super__Vector_base<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage;
  if ((psVar5 != (pointer)0x0) &&
     (iVar8 = (*(code *)(psVar5->super___shared_ptr<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2>).
                        _M_ptr[1].buff_.
                        super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr)(),
     _Var14._M_pi = extraout_RDX_03, 2 < iVar8)) {
    psVar5 = req[9].log_entries_.
             super__Vector_base<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
    msg_if_given_abi_cxx11_
              (&local_88,
               "bad remove server request as we are expecting one log entry with value type of int")
    ;
    (*(code *)(psVar5->super___shared_ptr<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2>)._M_ptr[1].
              buff_.super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
    )(psVar5,3,
      "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_join_leave.cxx"
      ,"handle_rm_srv_req",0x170,&local_88);
    _Var14._M_pi = extraout_RDX_04;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_88._M_dataplus._M_p != &local_88.field_2) {
      operator_delete(local_88._M_dataplus._M_p);
      _Var14._M_pi = extraout_RDX_05;
    }
  }
  *(undefined4 *)&(peVar9->sm_commit_index_).super___atomic_base<unsigned_long>._M_i = 0xfffffffc;
LAB_00221515:
  pVar17.super___shared_ptr<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var14._M_pi;
  pVar17.super___shared_ptr<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (ptr<resp_msg>)pVar17.super___shared_ptr<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

ptr<resp_msg> raft_server::handle_rm_srv_req(req_msg& req) {
    std::vector<ptr<log_entry>>& entries = req.log_entries();
    ptr<resp_msg> resp = cs_new<resp_msg>
                         ( state_->get_term(),
                           msg_type::remove_server_response,
                           id_,
                           leader_ );

    if (entries.size() != 1 || entries[0]->get_buf().size() != sz_int) {
        p_wn("bad remove server request as we are expecting "
             "one log entry with value type of int");
        resp->set_result_code(cmd_result_code::BAD_REQUEST);
        return resp;
    }

    if (role_ != srv_role::leader || write_paused_) {
        p_wn("this is not a leader, cannot handle RemoveServerRequest");
        resp->set_result_code(cmd_result_code::NOT_LEADER);
        return resp;
    }

    check_srv_to_leave_timeout();
    if (srv_to_leave_) {
        p_wn("previous to-be-removed server %d has not left yet",
             srv_to_leave_->get_id());
        resp->set_result_code(cmd_result_code::SERVER_IS_LEAVING);
        return resp;
    }
    // NOTE:
    //   Although `srv_to_leave_` is not set, we should check if
    //   there is any peer whose leave flag is set.
    for (auto& entry: peers_) {
        ptr<peer> pp = entry.second;
        if (pp->is_leave_flag_set()) {
            p_wn("leave flag of server %d is set, but the server "
                 "has not left yet",
                 pp->get_id());
            resp->set_result_code(cmd_result_code::SERVER_IS_LEAVING);
            return resp;
        }
    }

    if (config_changing_) {
        // the previous config has not committed yet
        p_wn("previous config has not committed yet");
        resp->set_result_code(cmd_result_code::CONFIG_CHANGING);
        return resp;
    }

    int32 srv_id = entries[0]->get_buf().get_int();
    if (srv_id == id_) {
        p_wn("cannot request to remove leader");
        resp->set_result_code(cmd_result_code::CANNOT_REMOVE_LEADER);
        return resp;
    }

    peer_itor pit = peers_.find(srv_id);
    if (pit == peers_.end()) {
        p_wn("server %d does not exist", srv_id);
        resp->set_result_code(cmd_result_code::SERVER_NOT_FOUND);
        return resp;
    }

    ptr<peer> p = pit->second;
    ptr<req_msg> leave_req( cs_new<req_msg>
                            ( state_->get_term(),
                              msg_type::leave_cluster_request,
                              id_, srv_id, 0,
                              log_store_->next_slot() - 1,
                              quick_commit_index_.load() ) );
    // WARNING:
    //   DO NOT reset HB counter to 0 as removing server
    //   may be requested multiple times, and anyway we should
    //   remove that server.
    p->set_leave_flag();

    if (p->make_busy()) {
        p->send_req(p, leave_req, ex_resp_handler_);
        p_in("sent leave request to peer %d", p->get_id());
    } else {
        p->set_rsv_msg(leave_req, ex_resp_handler_);
        p_in("peer %d is currently busy, keep the message", p->get_id());
    }

    resp->accept(log_store_->next_slot());
    return resp;
}